

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

void __thiscall om::net::mac_addr::mac_addr(mac_addr *this,string *str_)

{
  int iVar1;
  undefined8 uVar2;
  invalid_argument *this_00;
  uint8_t *local_50;
  uint local_48;
  uint i;
  undefined4 local_38;
  undefined1 auStack_34 [4];
  int temp [6];
  string *str__local;
  mac_addr *this_local;
  
  this->_addr[0] = '\0';
  local_50 = this->_addr + 1;
  do {
    *local_50 = '\0';
    local_50 = local_50 + 1;
  } while ((mac_addr *)local_50 != this + 1);
  memset(&local_38,0,0x18);
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = __isoc99_sscanf(uVar2,"%x:%x:%x:%x:%x:%x",&local_38,auStack_34,temp,temp + 1,temp + 2,
                          temp + 3);
  if (iVar1 != 6) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"mac_addr: invalid address format");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    this->_addr[local_48] = (uint8_t)*(undefined4 *)(auStack_34 + (ulong)local_48 * 4 + -4);
  }
  return;
}

Assistant:

explicit mac_addr(const std::string& str_)
			{
				int temp[6] = {0};


				if (std::sscanf(str_.c_str(), "%x:%x:%x:%x:%x:%x",
								&temp[0], &temp[1], &temp[2], &temp[3], &temp[4], &temp[5]) != 6)
					throw std::invalid_argument("mac_addr: invalid address format");

				for (unsigned i = 0; i < 6; i++)
					_addr[i] = (uint8_t) temp[i];
			}